

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FieldDescriptorProto::InternalSwap
          (FieldDescriptorProto *this,FieldDescriptorProto *other)

{
  InternalMetadataWithArena *this_00;
  int32 iVar1;
  int iVar2;
  uint32 uVar3;
  string *psVar4;
  FieldOptions *pFVar5;
  void *pvVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  UnknownFieldSet *pUVar8;
  UnknownFieldSet *pUVar9;
  
  psVar4 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar4;
  psVar4 = (this->extendee_).ptr_;
  (this->extendee_).ptr_ = (other->extendee_).ptr_;
  (other->extendee_).ptr_ = psVar4;
  psVar4 = (this->type_name_).ptr_;
  (this->type_name_).ptr_ = (other->type_name_).ptr_;
  (other->type_name_).ptr_ = psVar4;
  psVar4 = (this->default_value_).ptr_;
  (this->default_value_).ptr_ = (other->default_value_).ptr_;
  (other->default_value_).ptr_ = psVar4;
  psVar4 = (this->json_name_).ptr_;
  (this->json_name_).ptr_ = (other->json_name_).ptr_;
  (other->json_name_).ptr_ = psVar4;
  pFVar5 = this->options_;
  this->options_ = other->options_;
  other->options_ = pFVar5;
  iVar1 = this->number_;
  this->number_ = other->number_;
  other->number_ = iVar1;
  iVar1 = this->oneof_index_;
  this->oneof_index_ = other->oneof_index_;
  other->oneof_index_ = iVar1;
  iVar2 = this->label_;
  this->label_ = other->label_;
  other->label_ = iVar2;
  iVar2 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar2;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar6 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pUVar9 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar9 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
    }
    pvVar6 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pUVar8 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar8 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
    }
    pvVar7 = pUVar8->fields_;
    pUVar8->fields_ = pUVar9->fields_;
    pUVar9->fields_ = pvVar7;
  }
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void FieldDescriptorProto::InternalSwap(FieldDescriptorProto* other) {
  name_.Swap(&other->name_);
  extendee_.Swap(&other->extendee_);
  type_name_.Swap(&other->type_name_);
  default_value_.Swap(&other->default_value_);
  json_name_.Swap(&other->json_name_);
  std::swap(options_, other->options_);
  std::swap(number_, other->number_);
  std::swap(oneof_index_, other->oneof_index_);
  std::swap(label_, other->label_);
  std::swap(type_, other->type_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}